

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbitmap.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  char *__nptr;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 auVar5 [16];
  char cVar6;
  undefined2 uVar7;
  int iVar8;
  uint uVar9;
  SDL_Surface *pSVar10;
  SDL_Surface *pSVar11;
  long lVar12;
  ulong uVar13;
  size_t __n;
  void *__s;
  int iVar14;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  int iVar37;
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  undefined1 auVar39 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar44 [16];
  SDL_Rect dst;
  SDL_Event event;
  SDL_Color palette [256];
  short local_458;
  short local_456;
  undefined2 local_454;
  undefined2 local_452;
  char local_450 [6];
  short sStack_44a;
  char local_438 [1032];
  long lVar19;
  
  iVar8 = SDL_Init(0x20);
  if (iVar8 < 0) {
    main_cold_4();
    return 1;
  }
  uVar9 = 0;
  if (1 < argc) {
    uVar9 = 0;
    do {
      uVar1 = argc - 1;
      iVar8 = strcmp(argv[(ulong)(uint)argc - 2],"-bpp");
      __nptr = argv[uVar1];
      if (iVar8 == 0) {
        uVar9 = atoi(__nptr);
        argc = argc - 2;
      }
      else {
        iVar8 = strcmp(__nptr,"-warp");
        argc = uVar1;
        if (((iVar8 != 0) && (iVar8 = strcmp(__nptr,"-hw"), iVar8 != 0)) &&
           (iVar8 = strcmp(__nptr,"-fullscreen"), iVar8 != 0)) {
          main_cold_1();
          goto LAB_00101994;
        }
      }
    } while (1 < argc);
  }
  pSVar10 = (SDL_Surface *)SDL_SetVideoMode(0x280,0x1e0,uVar9 & 0xff);
  if (pSVar10 == (SDL_Surface *)0x0) {
LAB_00101994:
    main_cold_3();
  }
  else {
    if ((uVar9 & 0xff) == 8) {
      cVar6 = -1;
      lVar12 = 0;
      do {
        local_438[lVar12 * 4] = cVar6;
        local_438[lVar12 * 4 + 1] = cVar6;
        local_438[lVar12 * 4 + 2] = cVar6;
        lVar12 = lVar12 + 1;
        cVar6 = cVar6 + -1;
      } while (lVar12 != 0x100);
      SDL_SetColors(pSVar10,local_438,0,0x100);
    }
    iVar8 = SDL_LockSurface(pSVar10);
    if (-1 < iVar8) {
      __s = pSVar10->pixels;
      iVar8 = pSVar10->h;
      if (pSVar10->format->BytesPerPixel == '\x02') {
        if (0 < iVar8) {
          iVar14 = 0;
          do {
            uVar13 = (long)(iVar14 * 0xff) / (long)iVar8 & 0xff;
            uVar7 = SDL_MapRGB(pSVar10->format,uVar13,uVar13);
            auVar5 = _DAT_00102050;
            iVar8 = pSVar10->w;
            if (0 < (long)iVar8) {
              lVar12 = (long)iVar8 + -1;
              auVar15._8_4_ = (int)lVar12;
              auVar15._0_8_ = lVar12;
              auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
              auVar15 = auVar15 ^ _DAT_00102050;
              lVar12 = 0;
              auVar18 = _DAT_00102040;
              auVar20 = _DAT_00102030;
              auVar21 = _DAT_00102020;
              auVar22 = _DAT_00102010;
              do {
                auVar23 = auVar18 ^ auVar5;
                iVar37 = auVar15._0_4_;
                iVar36 = -(uint)(iVar37 < auVar23._0_4_);
                iVar16 = auVar15._4_4_;
                auVar24._4_4_ = -(uint)(iVar16 < auVar23._4_4_);
                iVar41 = auVar15._8_4_;
                iVar40 = -(uint)(iVar41 < auVar23._8_4_);
                iVar17 = auVar15._12_4_;
                auVar24._12_4_ = -(uint)(iVar17 < auVar23._12_4_);
                auVar33._4_4_ = iVar36;
                auVar33._0_4_ = iVar36;
                auVar33._8_4_ = iVar40;
                auVar33._12_4_ = iVar40;
                auVar42 = pshuflw(in_XMM8,auVar33,0xe8);
                auVar26._4_4_ = -(uint)(auVar23._4_4_ == iVar16);
                auVar26._12_4_ = -(uint)(auVar23._12_4_ == iVar17);
                auVar26._0_4_ = auVar26._4_4_;
                auVar26._8_4_ = auVar26._12_4_;
                auVar44 = pshuflw(in_XMM9,auVar26,0xe8);
                auVar24._0_4_ = auVar24._4_4_;
                auVar24._8_4_ = auVar24._12_4_;
                auVar43 = pshuflw(auVar42,auVar24,0xe8);
                auVar23._8_4_ = 0xffffffff;
                auVar23._0_8_ = 0xffffffffffffffff;
                auVar23._12_4_ = 0xffffffff;
                auVar23 = (auVar43 | auVar44 & auVar42) ^ auVar23;
                auVar23 = packssdw(auVar23,auVar23);
                if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)__s + lVar12) = uVar7;
                }
                auVar24 = auVar26 & auVar33 | auVar24;
                auVar23 = packssdw(auVar24,auVar24);
                auVar43._8_4_ = 0xffffffff;
                auVar43._0_8_ = 0xffffffffffffffff;
                auVar43._12_4_ = 0xffffffff;
                auVar23 = packssdw(auVar23 ^ auVar43,auVar23 ^ auVar43);
                if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined2 *)((long)__s + lVar12 + 2) = uVar7;
                }
                auVar23 = auVar20 ^ auVar5;
                iVar36 = -(uint)(iVar37 < auVar23._0_4_);
                auVar38._4_4_ = -(uint)(iVar16 < auVar23._4_4_);
                iVar40 = -(uint)(iVar41 < auVar23._8_4_);
                auVar38._12_4_ = -(uint)(iVar17 < auVar23._12_4_);
                auVar25._4_4_ = iVar36;
                auVar25._0_4_ = iVar36;
                auVar25._8_4_ = iVar40;
                auVar25._12_4_ = iVar40;
                auVar32._4_4_ = -(uint)(auVar23._4_4_ == iVar16);
                auVar32._12_4_ = -(uint)(auVar23._12_4_ == iVar17);
                auVar32._0_4_ = auVar32._4_4_;
                auVar32._8_4_ = auVar32._12_4_;
                auVar38._0_4_ = auVar38._4_4_;
                auVar38._8_4_ = auVar38._12_4_;
                auVar23 = auVar32 & auVar25 | auVar38;
                auVar23 = packssdw(auVar23,auVar23);
                auVar2._8_4_ = 0xffffffff;
                auVar2._0_8_ = 0xffffffffffffffff;
                auVar2._12_4_ = 0xffffffff;
                auVar23 = packssdw(auVar23 ^ auVar2,auVar23 ^ auVar2);
                if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)__s + lVar12 + 4) = uVar7;
                }
                auVar26 = pshufhw(auVar25,auVar25,0x84);
                auVar33 = pshufhw(auVar32,auVar32,0x84);
                auVar24 = pshufhw(auVar26,auVar38,0x84);
                auVar27._8_4_ = 0xffffffff;
                auVar27._0_8_ = 0xffffffffffffffff;
                auVar27._12_4_ = 0xffffffff;
                auVar27 = (auVar24 | auVar33 & auVar26) ^ auVar27;
                auVar26 = packssdw(auVar27,auVar27);
                if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)__s + lVar12 + 6) = uVar7;
                }
                auVar26 = auVar21 ^ auVar5;
                iVar36 = -(uint)(iVar37 < auVar26._0_4_);
                auVar29._4_4_ = -(uint)(iVar16 < auVar26._4_4_);
                iVar40 = -(uint)(iVar41 < auVar26._8_4_);
                auVar29._12_4_ = -(uint)(iVar17 < auVar26._12_4_);
                auVar34._4_4_ = iVar36;
                auVar34._0_4_ = iVar36;
                auVar34._8_4_ = iVar40;
                auVar34._12_4_ = iVar40;
                auVar23 = pshuflw(auVar23,auVar34,0xe8);
                auVar28._4_4_ = -(uint)(auVar26._4_4_ == iVar16);
                auVar28._12_4_ = -(uint)(auVar26._12_4_ == iVar17);
                auVar28._0_4_ = auVar28._4_4_;
                auVar28._8_4_ = auVar28._12_4_;
                in_XMM9 = pshuflw(auVar44 & auVar42,auVar28,0xe8);
                in_XMM9 = in_XMM9 & auVar23;
                auVar29._0_4_ = auVar29._4_4_;
                auVar29._8_4_ = auVar29._12_4_;
                auVar23 = pshuflw(auVar23,auVar29,0xe8);
                auVar42._8_4_ = 0xffffffff;
                auVar42._0_8_ = 0xffffffffffffffff;
                auVar42._12_4_ = 0xffffffff;
                auVar42 = (auVar23 | in_XMM9) ^ auVar42;
                auVar23 = packssdw(auVar42,auVar42);
                if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)__s + lVar12 + 8) = uVar7;
                }
                auVar29 = auVar28 & auVar34 | auVar29;
                auVar23 = packssdw(auVar29,auVar29);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar23 = packssdw(auVar23 ^ auVar44,auVar23 ^ auVar44);
                if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)__s + lVar12 + 10) = uVar7;
                }
                auVar23 = auVar22 ^ auVar5;
                iVar37 = -(uint)(iVar37 < auVar23._0_4_);
                auVar39._4_4_ = -(uint)(iVar16 < auVar23._4_4_);
                iVar41 = -(uint)(iVar41 < auVar23._8_4_);
                auVar39._12_4_ = -(uint)(iVar17 < auVar23._12_4_);
                auVar30._4_4_ = iVar37;
                auVar30._0_4_ = iVar37;
                auVar30._8_4_ = iVar41;
                auVar30._12_4_ = iVar41;
                auVar35._4_4_ = -(uint)(auVar23._4_4_ == iVar16);
                auVar35._12_4_ = -(uint)(auVar23._12_4_ == iVar17);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar39._0_4_ = auVar39._4_4_;
                auVar39._8_4_ = auVar39._12_4_;
                auVar23 = auVar35 & auVar30 | auVar39;
                auVar23 = packssdw(auVar23,auVar23);
                auVar3._8_4_ = 0xffffffff;
                auVar3._0_8_ = 0xffffffffffffffff;
                auVar3._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar23 ^ auVar3,auVar23 ^ auVar3);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)__s + lVar12 + 0xc) = uVar7;
                }
                auVar23 = pshufhw(auVar30,auVar30,0x84);
                auVar24 = pshufhw(auVar35,auVar35,0x84);
                auVar26 = pshufhw(auVar23,auVar39,0x84);
                auVar31._8_4_ = 0xffffffff;
                auVar31._0_8_ = 0xffffffffffffffff;
                auVar31._12_4_ = 0xffffffff;
                auVar31 = (auVar26 | auVar24 & auVar23) ^ auVar31;
                auVar23 = packssdw(auVar31,auVar31);
                if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)__s + lVar12 + 0xe) = uVar7;
                }
                lVar19 = auVar18._8_8_;
                auVar18._0_8_ = auVar18._0_8_ + 8;
                auVar18._8_8_ = lVar19 + 8;
                lVar19 = auVar20._8_8_;
                auVar20._0_8_ = auVar20._0_8_ + 8;
                auVar20._8_8_ = lVar19 + 8;
                lVar19 = auVar21._8_8_;
                auVar21._0_8_ = auVar21._0_8_ + 8;
                auVar21._8_8_ = lVar19 + 8;
                lVar19 = auVar22._8_8_;
                auVar22._0_8_ = auVar22._0_8_ + 8;
                auVar22._8_8_ = lVar19 + 8;
                lVar12 = lVar12 + 0x10;
              } while ((ulong)(iVar8 + 7U >> 3) << 4 != lVar12);
            }
            __s = (void *)((long)__s + (ulong)pSVar10->pitch);
            iVar14 = iVar14 + 1;
            iVar8 = pSVar10->h;
          } while (iVar14 < iVar8);
        }
      }
      else if (0 < iVar8) {
        __n = (size_t)pSVar10->pitch;
        iVar14 = 0;
        iVar37 = 0;
        do {
          memset(__s,iVar14 / iVar8,__n);
          __n = (size_t)pSVar10->pitch;
          __s = (void *)((long)__s + __n);
          iVar37 = iVar37 + 1;
          iVar8 = pSVar10->h;
          iVar14 = iVar14 + 0xff;
        } while (iVar37 < iVar8);
      }
      SDL_UnlockSurface(pSVar10);
      pSVar11 = pSVar10;
      SDL_UpdateRect(pSVar10,0,0,0,0);
      pSVar11 = LoadXBM(pSVar11,0x20,0x20,(Uint8 *)picture_bits);
      if (pSVar11 != (SDL_Surface *)0x0) {
        do {
          do {
            iVar8 = SDL_PollEvent(local_450);
          } while (iVar8 == 0);
          bVar4 = false;
          do {
            if ((local_450[0] == '\x02') || (local_450[0] == '\f')) {
              bVar4 = true;
            }
            else if (local_450[0] == '\x05') {
              iVar8 = pSVar11->w;
              local_458 = (short)stack0xfffffffffffffbb4 -
                          (short)((uint)(iVar8 - (iVar8 >> 0x1f)) >> 1);
              iVar14 = pSVar11->h;
              local_456 = sStack_44a - (short)((uint)(iVar14 - (iVar14 >> 0x1f)) >> 1);
              local_454 = (undefined2)iVar8;
              local_452 = (undefined2)iVar14;
              SDL_UpperBlit(pSVar11,0,pSVar10,&local_458);
              SDL_UpdateRects(pSVar10,1,&local_458);
            }
            iVar8 = SDL_PollEvent(local_450);
          } while (iVar8 != 0);
        } while (!bVar4);
        SDL_FreeSurface(pSVar11);
        SDL_Quit();
        return 0;
      }
      goto LAB_001019a1;
    }
  }
  main_cold_2();
LAB_001019a1:
  SDL_Quit();
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_Surface *bitmap;
	Uint8  video_bpp;
	Uint32 videoflags;
	Uint8 *buffer;
	int i, k, done;
	SDL_Event event;
	Uint16 *buffer16;
        Uint16 color;
        Uint8  gradient;
	SDL_Color palette[256];


	/* Initialize SDL */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	video_bpp = 0;
	videoflags = SDL_SWSURFACE;
	while ( argc > 1 ) {
		--argc;
		if ( strcmp(argv[argc-1], "-bpp") == 0 ) {
			video_bpp = atoi(argv[argc]);
			--argc;
		} else
		if ( strcmp(argv[argc], "-warp") == 0 ) {
			videoflags |= SDL_HWPALETTE;
		} else
		if ( strcmp(argv[argc], "-hw") == 0 ) {
			videoflags |= SDL_HWSURFACE;
		} else
		if ( strcmp(argv[argc], "-fullscreen") == 0 ) {
			videoflags |= SDL_FULLSCREEN;
		} else {
			fprintf(stderr,
			"Usage: %s [-bpp N] [-warp] [-hw] [-fullscreen]\n",
								argv[0]);
			quit(1);
		}
	}

	/* Set 640x480 video mode */
	if ( (screen=SDL_SetVideoMode(640,480,video_bpp,videoflags)) == NULL ) {
		fprintf(stderr, "Couldn't set 640x480x%d video mode: %s\n",
						video_bpp, SDL_GetError());
		quit(2);
	}

	if (video_bpp==8) {
		/* Set a gray colormap, reverse order from white to black */
		for ( i=0; i<256; ++i ) {
			palette[i].r = 255-i;
			palette[i].g = 255-i;
			palette[i].b = 255-i;
		}
		SDL_SetColors(screen, palette, 0, 256);
	}

	/* Set the surface pixels and refresh! */
	if ( SDL_LockSurface(screen) < 0 ) {
		fprintf(stderr, "Couldn't lock the display surface: %s\n",
							SDL_GetError());
		quit(2);
	}
	buffer=(Uint8 *)screen->pixels;
	if (screen->format->BytesPerPixel!=2) {
        	for ( i=0; i<screen->h; ++i ) {
        		memset(buffer,(i*255)/screen->h, screen->pitch);
        		buffer += screen->pitch;
        	}
        }
        else
        {
		for ( i=0; i<screen->h; ++i ) {
			gradient=((i*255)/screen->h);
                        color = SDL_MapRGB(screen->format, gradient, gradient, gradient);
                        buffer16=(Uint16*)buffer;
                        for (k=0; k<screen->w; k++)
                        {
                            *(buffer16+k)=color;
                        }
			buffer += screen->pitch;
		}
        }
	SDL_UnlockSurface(screen);
	SDL_UpdateRect(screen, 0, 0, 0, 0);

	/* Load the bitmap */
	bitmap = LoadXBM(screen, picture_width, picture_height,
					(Uint8 *)picture_bits);
	if ( bitmap == NULL ) {
		quit(1);
	}

	/* Wait for a keystroke */
	done = 0;
	while ( !done ) {
		/* Check for events */
		while ( SDL_PollEvent(&event) ) {
			switch (event.type) {
				case SDL_MOUSEBUTTONDOWN: {
					SDL_Rect dst;

					dst.x = event.button.x - bitmap->w/2;
					dst.y = event.button.y - bitmap->h/2;
					dst.w = bitmap->w;
					dst.h = bitmap->h;
					SDL_BlitSurface(bitmap, NULL,
								screen, &dst);
					SDL_UpdateRects(screen,1,&dst);
					}
					break;
				case SDL_KEYDOWN:
					/* Any key press quits the app... */
					done = 1;
					break;
				case SDL_QUIT:
					done = 1;
					break;
				default:
					break;
			}
		}
	}
	SDL_FreeSurface(bitmap);
	SDL_Quit();
	return(0);
}